

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O3

void __thiscall
QMdi::ControllerWidget::setControlVisible
          (ControllerWidget *this,WindowStateAction action,bool visible)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  if (action == MinimizeAction) {
    uVar2 = 1;
  }
  else if (action == MaximizeAction) {
    uVar2 = 2;
  }
  else {
    if (action != CloseAction) {
      return;
    }
    uVar2 = 4;
  }
  uVar1 = (this->visibleControls).super_QFlagsStorageHelper<QStyle::SubControl,_4>.
          super_QFlagsStorage<QStyle::SubControl>.i;
  uVar3 = uVar1 | uVar2;
  if ((uVar1 & uVar2) != 0) {
    uVar3 = ~uVar2 & uVar1;
  }
  if (!visible) {
    uVar3 = ~uVar2 & uVar1;
  }
  (this->visibleControls).super_QFlagsStorageHelper<QStyle::SubControl,_4>.
  super_QFlagsStorage<QStyle::SubControl>.i = uVar3;
  return;
}

Assistant:

void ControllerWidget::setControlVisible(QMdiSubWindowPrivate::WindowStateAction action, bool visible)
{
    QStyle::SubControl subControl = QStyle::SC_None;

    // Map action from QMdiSubWindowPrivate::WindowStateAction to QStyle::SubControl.
    if (action == QMdiSubWindowPrivate::MaximizeAction)
        subControl = QStyle::SC_MdiNormalButton;
    else if (action == QMdiSubWindowPrivate::CloseAction)
        subControl = QStyle::SC_MdiCloseButton;
    else if (action == QMdiSubWindowPrivate::MinimizeAction)
        subControl = QStyle::SC_MdiMinButton;

    if (subControl == QStyle::SC_None)
        return;

    visibleControls.setFlag(subControl, visible && !(visibleControls & subControl));
}